

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O2

wchar_t iconv_strncat_in_locale(archive_string *as,void *_p,size_t length,archive_string_conv *sc)

{
  iconv_t __cd;
  archive_string_conv *paVar1;
  wchar_t wVar2;
  uchar *p;
  archive_string *paVar3;
  size_t sVar4;
  int *piVar5;
  ulong uVar6;
  wchar_t wVar7;
  ulong uVar8;
  ulong uVar9;
  char *outp;
  ulong local_68;
  size_t remaining;
  wchar_t local_54;
  char *itp;
  ulong local_48;
  archive_string_conv *local_40;
  char *local_38;
  
  wVar2 = sc->flag;
  uVar9 = (ulong)((wVar2 & 0x1400U) != 0);
  uVar6 = 2 - (ulong)((wVar2 & 0x2800U) == 0);
  local_38 = (char *)_p;
  paVar3 = archive_string_ensure(as,uVar9 + length * 2 + as->length + 1);
  if (paVar3 == (archive_string *)0x0) {
    wVar7 = L'\xffffffff';
  }
  else {
    uVar9 = ~uVar9;
    local_48 = (ulong)((wVar2 & 0x1400U) != 0);
    __cd = sc->cd;
    itp = local_38;
    outp = as->s + as->length;
    local_68 = (uVar9 - as->length) + as->buffer_length;
    wVar7 = L'\0';
    remaining = length;
    local_54 = wVar2;
    local_40 = sc;
    while ((uVar6 <= remaining &&
           (sVar4 = iconv(__cd,&itp,&remaining,&outp,&local_68), sVar4 == 0xffffffffffffffff))) {
      piVar5 = __errno_location();
      paVar1 = local_40;
      if ((*piVar5 == 0x54) || (*piVar5 == 0x16)) {
        wVar2 = local_40->flag;
        if ((wVar2 & 0x1500U) == 0) {
          *outp = '?';
          local_68 = local_68 - 1;
          outp = outp + 1;
        }
        else {
          uVar8 = (ulong)(((uint)wVar2 >> 8 & 1) != 0) + 2;
          if (local_68 < uVar8) {
            as->length = (long)outp - (long)as->s;
            paVar3 = archive_string_ensure
                               (as,as->buffer_length + uVar8 +
                                   (remaining << ((byte)local_48 & 0x3f)));
            if (paVar3 == (archive_string *)0x0) {
              return L'\xffffffff';
            }
            outp = as->s + as->length;
            local_68 = (uVar9 - as->length) + as->buffer_length;
            wVar2 = paVar1->flag;
          }
          if (((uint)wVar2 >> 8 & 1) == 0) {
            if (((uint)wVar2 >> 10 & 1) == 0) {
              outp[0] = -3;
              outp[1] = -1;
            }
            else {
              outp[0] = -1;
              outp[1] = -3;
            }
          }
          else {
            *outp = -0x11;
            outp[1] = -0x41;
            outp[2] = -0x43;
          }
          local_68 = local_68 - uVar8;
          outp = outp + uVar8;
        }
        itp = itp + uVar6;
        remaining = remaining - uVar6;
        wVar7 = L'\xffffffff';
      }
      else {
        as->length = (long)outp - (long)as->s;
        paVar3 = archive_string_ensure(as,remaining * 2 + as->buffer_length);
        if (paVar3 == (archive_string *)0x0) {
          return L'\xffffffff';
        }
        outp = as->s + as->length;
        local_68 = (uVar9 - as->length) + as->buffer_length;
      }
    }
    as->length = (long)outp - (long)as->s;
    *outp = '\0';
    if ((local_54 & 0x1400U) != 0) {
      as->s[as->length + 1] = '\0';
    }
  }
  return wVar7;
}

Assistant:

static int
iconv_strncat_in_locale(struct archive_string *as, const void *_p,
    size_t length, struct archive_string_conv *sc)
{
	ICONV_CONST char *itp;
	size_t remaining;
	iconv_t cd;
	char *outp;
	size_t avail, bs;
	int return_value = 0; /* success */
	int to_size, from_size;

	if (sc->flag & SCONV_TO_UTF16)
		to_size = 2;
	else
		to_size = 1;
	if (sc->flag & SCONV_FROM_UTF16)
		from_size = 2;
	else
		from_size = 1;

	if (archive_string_ensure(as, as->length + length*2+to_size) == NULL)
		return (-1);

	cd = sc->cd;
	itp = (char *)(uintptr_t)_p;
	remaining = length;
	outp = as->s + as->length;
	avail = as->buffer_length - as->length - to_size;
	while (remaining >= (size_t)from_size) {
		size_t result = iconv(cd, &itp, &remaining, &outp, &avail);

		if (result != (size_t)-1)
			break; /* Conversion completed. */

		if (errno == EILSEQ || errno == EINVAL) {
			/*
		 	 * If an output charset is UTF-8 or UTF-16BE/LE,
			 * unknown character should be U+FFFD
			 * (replacement character).
			 */
			if (sc->flag & (SCONV_TO_UTF8 | SCONV_TO_UTF16)) {
				size_t rbytes;
				if (sc->flag & SCONV_TO_UTF8)
					rbytes = UTF8_R_CHAR_SIZE;
				else
					rbytes = 2;

				if (avail < rbytes) {
					as->length = outp - as->s;
					bs = as->buffer_length +
					    (remaining * to_size) + rbytes;
					if (NULL ==
					    archive_string_ensure(as, bs))
						return (-1);
					outp = as->s + as->length;
					avail = as->buffer_length
					    - as->length - to_size;
				}
				if (sc->flag & SCONV_TO_UTF8)
					UTF8_SET_R_CHAR(outp);
				else if (sc->flag & SCONV_TO_UTF16BE)
					archive_be16enc(outp, UNICODE_R_CHAR);
				else
					archive_le16enc(outp, UNICODE_R_CHAR);
				outp += rbytes;
				avail -= rbytes;
			} else {
				/* Skip the illegal input bytes. */
				*outp++ = '?';
				avail--;
			}
			itp += from_size;
			remaining -= from_size;
			return_value = -1; /* failure */
		} else {
			/* E2BIG no output buffer,
			 * Increase an output buffer.  */
			as->length = outp - as->s;
			bs = as->buffer_length + remaining * 2;
			if (NULL == archive_string_ensure(as, bs))
				return (-1);
			outp = as->s + as->length;
			avail = as->buffer_length - as->length - to_size;
		}
	}
	as->length = outp - as->s;
	as->s[as->length] = 0;
	if (to_size == 2)
		as->s[as->length+1] = 0;
	return (return_value);
}